

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_GenFree(DdGen *gen)

{
  DdGen *gen_local;
  
  if (gen != (DdGen *)0x0) {
    switch(gen->type) {
    case 0:
    case 3:
      if ((gen->gen).cubes.cube != (int *)0x0) {
        free((gen->gen).cubes.cube);
        (gen->gen).cubes.cube = (int *)0x0;
      }
      if ((gen->stack).stack != (DdNode **)0x0) {
        free((gen->stack).stack);
        (gen->stack).stack = (DdNode **)0x0;
      }
      break;
    case 1:
      if ((gen->gen).cubes.cube != (int *)0x0) {
        free((gen->gen).cubes.cube);
        (gen->gen).cubes.cube = (int *)0x0;
      }
      Cudd_RecursiveDeref(gen->manager,gen->node);
      break;
    case 2:
      if ((gen->stack).stack != (DdNode **)0x0) {
        free((gen->stack).stack);
        (gen->stack).stack = (DdNode **)0x0;
      }
      break;
    default:
      goto switchD_00a38c36_default;
    }
    if (gen != (DdGen *)0x0) {
      free(gen);
    }
  }
switchD_00a38c36_default:
  return 0;
}

Assistant:

int
Cudd_GenFree(
  DdGen * gen)
{
    if (gen == NULL) return(0);
    switch (gen->type) {
    case CUDD_GEN_CUBES:
    case CUDD_GEN_ZDD_PATHS:
        ABC_FREE(gen->gen.cubes.cube);
        ABC_FREE(gen->stack.stack);
        break;
    case CUDD_GEN_PRIMES:
        ABC_FREE(gen->gen.primes.cube);
        Cudd_RecursiveDeref(gen->manager,gen->node);
        break;
    case CUDD_GEN_NODES:
        ABC_FREE(gen->stack.stack);
        break;
    default:
        return(0);
    }
    ABC_FREE(gen);
    return(0);

}